

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_block_active_visitor.cpp
# Opt level: O0

ir_visitor_status __thiscall
link_uniform_block_active_visitor::visit_enter
          (link_uniform_block_active_visitor *this,ir_dereference_array *ir)

{
  gl_shader_program *prog;
  bool bVar1;
  glsl_interface_packing gVar2;
  ir_dereference_variable *piVar3;
  link_uniform_block_active *block;
  glsl_type *pgVar4;
  ir_variable *local_50;
  link_uniform_block_active *b;
  ir_variable *var;
  ir_dereference_variable *d;
  ir_dereference_array *base_ir;
  ir_dereference_array *ir_local;
  link_uniform_block_active_visitor *this_local;
  
  d = (ir_dereference_variable *)ir;
  while ((d->var->super_ir_instruction).ir_type == ir_type_dereference_array) {
    d = (ir_dereference_variable *)
        ir_instruction::as_dereference_array(&d->var->super_ir_instruction);
  }
  piVar3 = ir_instruction::as_dereference_variable(&d->var->super_ir_instruction);
  if (piVar3 == (ir_dereference_variable *)0x0) {
    local_50 = (ir_variable *)0x0;
  }
  else {
    local_50 = piVar3->var;
  }
  if (((local_50 == (ir_variable *)0x0) ||
      (bVar1 = ir_variable::is_in_buffer_block(local_50), !bVar1)) ||
     (bVar1 = ir_variable::is_interface_instance(local_50), !bVar1)) {
    this_local._4_4_ = visit_continue;
  }
  else {
    block = process_block(this->mem_ctx,this->ht,local_50);
    if (block == (link_uniform_block_active *)0x0) {
      prog = this->prog;
      pgVar4 = ir_variable::get_interface_type(local_50);
      linker_error(prog,"uniform block `%s\' has mismatching definitions",pgVar4->name);
      (this->super_ir_hierarchical_visitor).field_0x31 = 0;
      this_local._4_4_ = visit_stop;
    }
    else {
      if ((block->has_instance_name & 1U) == 0) {
        __assert_fail("b->has_instance_name",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0xfe,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit_enter(ir_dereference_array *)"
                     );
      }
      if (block->type == (glsl_type *)0x0) {
        __assert_fail("b->type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0xff,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit_enter(ir_dereference_array *)"
                     );
      }
      gVar2 = ir_variable::get_interface_type_packing(local_50);
      if (gVar2 == GLSL_INTERFACE_PACKING_PACKED) {
        block->var = local_50;
        process_arrays(this->mem_ctx,ir,block);
      }
      this_local._4_4_ = visit_continue_with_parent;
    }
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
link_uniform_block_active_visitor::visit_enter(ir_dereference_array *ir)
{
   /* cycle through arrays of arrays */
   ir_dereference_array *base_ir = ir;
   while (base_ir->array->ir_type == ir_type_dereference_array)
      base_ir = base_ir->array->as_dereference_array();

   ir_dereference_variable *const d =
      base_ir->array->as_dereference_variable();
   ir_variable *const var = (d == NULL) ? NULL : d->var;

   /* If the r-value being dereferenced is not a variable (e.g., a field of a
    * structure) or is not a uniform block instance, continue.
    *
    * WARNING: It is not enough for the variable to be part of uniform block.
    * It must represent the entire block.  Arrays (or matrices) inside blocks
    * that lack an instance name are handled by the ir_dereference_variable
    * function.
    */
   if (var == NULL
       || !var->is_in_buffer_block()
       || !var->is_interface_instance())
      return visit_continue;

   /* Process the block.  Bail if there was an error. */
   link_uniform_block_active *const b =
      process_block(this->mem_ctx, this->ht, var);
   if (b == NULL) {
      linker_error(prog,
                   "uniform block `%s' has mismatching definitions",
                   var->get_interface_type()->name);
      this->success = false;
      return visit_stop;
   }

   /* Block arrays must be declared with an instance name.
    */
   assert(b->has_instance_name);
   assert(b->type != NULL);

   /* If the block array was declared with a shared or std140 layout
    * qualifier, all its instances have been already marked as used in
    * link_uniform_block_active_visitor::visit(ir_variable *).
    */
   if (var->get_interface_type_packing() == GLSL_INTERFACE_PACKING_PACKED) {
      b->var = var;
      process_arrays(this->mem_ctx, ir, b);
   }

   return visit_continue_with_parent;
}